

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O0

Platform * __thiscall efsw::Platform::findDevicePath(Platform *this,string *directory)

{
  char *pcVar1;
  __type _Var2;
  allocator local_69;
  uint local_68;
  allocator local_63;
  undefined1 local_62;
  allocator local_61;
  string local_60 [8];
  string dirName;
  allocator local_29;
  long local_28;
  FILE *aFile;
  mntent *ent;
  string *directory_local;
  string *fsName;
  
  ent = (mntent *)directory;
  directory_local = (string *)this;
  local_28 = setmntent("/proc/mounts","r");
  if (local_28 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    do {
      aFile = (FILE *)getmntent(local_28);
      if (aFile == (FILE *)0x0) {
        endmntent(local_28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,"",&local_69);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
        return this;
      }
      pcVar1 = *(char **)(aFile + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,pcVar1,&local_61);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)ent);
      if (_Var2) {
        local_62 = 0;
        pcVar1 = *(char **)aFile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,pcVar1,&local_63);
        std::allocator<char>::~allocator((allocator<char> *)&local_63);
        endmntent(local_28);
        local_62 = 1;
      }
      local_68 = (uint)_Var2;
      std::__cxx11::string::~string(local_60);
    } while (local_68 == 0);
  }
  return this;
}

Assistant:

std::string findDevicePath( const std::string& directory ) {
	struct mntent* ent;
	FILE* aFile;

	aFile = setmntent( "/proc/mounts", "r" );

	if ( aFile == NULL )
		return "";

	while ( NULL != ( ent = getmntent( aFile ) ) ) {
		std::string dirName( ent->mnt_dir );

		if ( dirName == directory ) {
			std::string fsName( ent->mnt_fsname );

			endmntent( aFile );

			return fsName;
		}
	}

	endmntent( aFile );

	return "";
}